

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbarinfo_commands.cpp
# Opt level: O1

void __thiscall CommandDrawGem::Parse(CommandDrawGem *this,FScanner *sc,bool fullScreenOffsets)

{
  char cVar1;
  SBarInfo *pSVar2;
  bool bVar3;
  int iVar4;
  int *piVar5;
  
  bVar3 = FScanner::CheckToken(sc,0x101);
  if (bVar3) {
    do {
      bVar3 = FScanner::Compare(sc,"wiggle");
      if (bVar3) {
        this->wiggle = true;
      }
      else {
        bVar3 = FScanner::Compare(sc,"translatable");
        if (bVar3) {
          this->translatable = true;
        }
        else {
          bVar3 = FScanner::Compare(sc,"armor");
          if (bVar3) {
            this->armor = true;
          }
          else {
            bVar3 = FScanner::Compare(sc,"interpolate");
            if (bVar3) {
              FScanner::MustGetToken(sc,0x28);
              FScanner::MustGetToken(sc,0x104);
              this->interpolationSpeed = sc->Number;
              FScanner::MustGetToken(sc,0x29);
            }
            else {
              bVar3 = FScanner::Compare(sc,"reverse");
              if (bVar3) {
                this->reverse = true;
              }
              else {
                FScanner::ScriptError(sc,"Unknown drawgem flag \'%s\'.",sc->String);
              }
            }
          }
        }
      }
      bVar3 = FScanner::CheckToken(sc,0x7c);
      if (!bVar3) {
        FScanner::MustGetToken(sc,0x2c);
      }
      bVar3 = FScanner::CheckToken(sc,0x101);
    } while (bVar3);
  }
  FScanner::MustGetToken(sc,0x102);
  iVar4 = SBarInfo::newImage((this->super_SBarInfoCommand).script,sc->String);
  this->chain = iVar4;
  FScanner::MustGetToken(sc,0x2c);
  FScanner::MustGetToken(sc,0x102);
  iVar4 = SBarInfo::newImage((this->super_SBarInfoCommand).script,sc->String);
  this->gem = iVar4;
  FScanner::MustGetToken(sc,0x2c);
  bVar3 = FScanner::CheckToken(sc,0x2d);
  FScanner::MustGetToken(sc,0x104);
  iVar4 = -sc->Number;
  if (!bVar3) {
    iVar4 = sc->Number;
  }
  this->leftPadding = iVar4;
  FScanner::MustGetToken(sc,0x2c);
  bVar3 = FScanner::CheckToken(sc,0x2d);
  FScanner::MustGetToken(sc,0x104);
  iVar4 = -sc->Number;
  if (!bVar3) {
    iVar4 = sc->Number;
  }
  this->rightPadding = iVar4;
  FScanner::MustGetToken(sc,0x2c);
  FScanner::MustGetToken(sc,0x104);
  if (sc->Number < 0) {
    FScanner::ScriptError(sc,"Chain size must be a positive number.");
  }
  this->chainSize = sc->Number + 1;
  FScanner::MustGetToken(sc,0x2c);
  SBarInfoCommand::GetCoordinates
            (&this->super_SBarInfoCommand,sc,fullScreenOffsets,&this->x,&this->y);
  FScanner::MustGetToken(sc,0x3b);
  pSVar2 = (this->super_SBarInfoCommand).script;
  if (this->armor == false) {
    piVar5 = &pSVar2->interpolationSpeed;
    cVar1 = pSVar2->interpolateHealth;
  }
  else {
    piVar5 = &pSVar2->armorInterpolationSpeed;
    cVar1 = pSVar2->interpolateArmor;
  }
  if (cVar1 == '\0') {
    piVar5 = &this->interpolationSpeed;
  }
  this->interpolationSpeed = *piVar5;
  return;
}

Assistant:

void	Parse(FScanner &sc, bool fullScreenOffsets)
		{
			while(sc.CheckToken(TK_Identifier))
			{
				if(sc.Compare("wiggle"))
					wiggle = true;
				else if(sc.Compare("translatable"))
					translatable = true;
				else if(sc.Compare("armor"))
					armor = true;
				else if(sc.Compare("interpolate"))
				{
					sc.MustGetToken('(');
					sc.MustGetToken(TK_IntConst);
					interpolationSpeed = sc.Number;
					sc.MustGetToken(')');
				}
				else if(sc.Compare("reverse"))
					reverse = true;
				else
					sc.ScriptError("Unknown drawgem flag '%s'.", sc.String);
				if(!sc.CheckToken('|'))
					sc.MustGetToken(',');
			}
			sc.MustGetToken(TK_StringConst); //chain
			chain = script->newImage(sc.String);
			sc.MustGetToken(',');
			sc.MustGetToken(TK_StringConst); //gem
			gem = script->newImage(sc.String);
			sc.MustGetToken(',');
			bool negative = sc.CheckToken('-');
			sc.MustGetToken(TK_IntConst);
			leftPadding = (negative ? -1 : 1) * sc.Number;
			sc.MustGetToken(',');
			negative = sc.CheckToken('-');
			sc.MustGetToken(TK_IntConst);
			rightPadding = (negative ? -1 : 1) * sc.Number;
			sc.MustGetToken(',');
			sc.MustGetToken(TK_IntConst);
			if(sc.Number < 0)
				sc.ScriptError("Chain size must be a positive number.");
			chainSize = sc.Number+1;
			sc.MustGetToken(',');
			GetCoordinates(sc, fullScreenOffsets, x, y);
			sc.MustGetToken(';');
		
			if(!armor)
				interpolationSpeed = script->interpolateHealth ? script->interpolationSpeed : interpolationSpeed;
			else
				interpolationSpeed = script->interpolateArmor ? script->armorInterpolationSpeed : interpolationSpeed;
		}